

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

CAmount wallet::OutputGetCredit(CWallet *wallet,CTxOut *txout,isminefilter *filter)

{
  long lVar1;
  isminetype iVar2;
  runtime_error *this;
  CAmount CVar3;
  long in_FS_OFFSET;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)txout->nValue < 0x775f05a074001) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock2,&wallet->cs_wallet,"wallet.cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/receive.cpp"
               ,0x23,false);
    iVar2 = CWallet::IsMine(wallet,txout);
    if ((*filter & iVar2) == ISMINE_NO) {
      CVar3 = 0;
    }
    else {
      CVar3 = txout->nValue;
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return CVar3;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"OutputGetCredit",&local_69);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &criticalblock2,&local_68,": value out of range");
    std::runtime_error::runtime_error(this,(string *)&criticalblock2);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

CAmount OutputGetCredit(const CWallet& wallet, const CTxOut& txout, const isminefilter& filter)
{
    if (!MoneyRange(txout.nValue))
        throw std::runtime_error(std::string(__func__) + ": value out of range");
    LOCK(wallet.cs_wallet);
    return ((wallet.IsMine(txout) & filter) ? txout.nValue : 0);
}